

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

void __thiscall
SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U>::insert
          (SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U> *this,uint *key)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  
  if (*key == 0) {
    __assert_fail("key != Key()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                  ,0xd9,
                  "void SmallDenseSet<unsigned int, SmallDenseMapUnsignedHasher, 32>::insert(const Key &) [Key = unsigned int, Hasher = SmallDenseMapUnsignedHasher, N = 32]"
                 );
  }
  if (this->bucketCount <= (this->count >> 2) + this->count) {
    rehash(this);
  }
  uVar3 = this->bucketCount - 1;
  if (this->bucketCount != 0) {
    uVar4 = *key * -0x61c88647 & uVar3;
    puVar2 = this->data;
    uVar5 = 1;
    do {
      uVar1 = puVar2[uVar4];
      if (uVar1 == 0) {
        puVar2[uVar4] = *key;
        this->count = this->count + 1;
LAB_002a44d8:
        bVar6 = false;
      }
      else {
        if (uVar1 == *key) goto LAB_002a44d8;
        uVar4 = uVar4 + uVar5 & uVar3;
        bVar6 = true;
      }
      if (!bVar6) {
        return;
      }
      bVar6 = uVar5 < this->bucketCount;
      uVar5 = uVar5 + 1;
    } while (bVar6);
  }
  __assert_fail("!\"couldn\'t insert node\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/DenseMap.h"
                ,0xf5,
                "void SmallDenseSet<unsigned int, SmallDenseMapUnsignedHasher, 32>::insert(const Key &) [Key = unsigned int, Hasher = SmallDenseMapUnsignedHasher, N = 32]"
               );
}

Assistant:

void insert(const Key& key)
	{
		// Default value is used as an empty marker
		assert(key != Key());

		// Keep occupancy at <80%
		if(count + (count >> 2) >= bucketCount)
			rehash();

		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Key &item = data[bucket];

			if(item == Key())
			{
				item = key;

				count++;
				return;
			}

			if(item == key)
				return;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		assert(!"couldn't insert node");
	}